

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::MILSpec::DictionaryValue::~DictionaryValue(DictionaryValue *this)

{
  ~DictionaryValue(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

DictionaryValue::~DictionaryValue() {
  // @@protoc_insertion_point(destructor:CoreML.Specification.MILSpec.DictionaryValue)
  if (GetArenaForAllocation() != nullptr) return;
  SharedDtor();
  _internal_metadata_.Delete<std::string>();
}